

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_delete_prev_char(EditLine *el,wint_t c)

{
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).buffer < (el->el_line).cursor) {
    if ((el->el_state).doingarg == L'\0') {
      c_delbefore1(el);
    }
    else {
      c_delbefore(el,(el->el_state).argument);
    }
    (el->el_line).cursor = (el->el_line).cursor + -(long)(el->el_state).argument;
    if ((el->el_line).cursor < (el->el_line).buffer) {
      (el->el_line).cursor = (el->el_line).buffer;
    }
    el_local._7_1_ = '\x04';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_delete_prev_char(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor <= el->el_line.buffer)
		return CC_ERROR;

	if (el->el_state.doingarg)
		c_delbefore(el, el->el_state.argument);
	else
		c_delbefore1(el);
	el->el_line.cursor -= el->el_state.argument;
	if (el->el_line.cursor < el->el_line.buffer)
		el->el_line.cursor = el->el_line.buffer;
	return CC_REFRESH;
}